

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.hpp
# Opt level: O2

void __thiscall RuntimeVariableSymbol::~RuntimeVariableSymbol(RuntimeVariableSymbol *this)

{
  (this->super_RuntimeSymbol)._vptr_RuntimeSymbol =
       (_func_int **)&PTR__RuntimeVariableSymbol_00149180;
  std::
  deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
  ::~deque(&(this->context_).scopes_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->value_).super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&this->name_);
  return;
}

Assistant:

RuntimeVariableSymbol(const std::string& name, const TypeName& type,
          std::shared_ptr<ExpressionNode> value, const Context& context):
    name_(name), type_(type), value_(std::move(value)), context_(context)
  {}